

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar43 [16];
  int sizes [17];
  int next_code [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  int aiStack_78 [18];
  
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_88 = 0;
  memset(z,0,0x400);
  if (0 < num) {
    uVar13 = 0;
    do {
      *(int *)(local_c8 + (ulong)sizelist[uVar13] * 4) =
           *(int *)(local_c8 + (ulong)sizelist[uVar13] * 4) + 1;
      uVar13 = uVar13 + 1;
    } while ((uint)num != uVar13);
  }
  lVar14 = 1;
  do {
    if (1 << ((byte)lVar14 & 0x1f) < *(int *)(local_c8 + lVar14 * 4)) {
      stbi__g_failure_reason = "bad sizes";
      return 0;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  lVar14 = 0;
  bVar9 = 0xf;
  iVar17 = 0;
  iVar18 = 0;
  while( true ) {
    aiStack_78[lVar14 + 1] = iVar18;
    z->firstcode[lVar14 + 1] = (stbi__uint16)iVar18;
    z->firstsymbol[lVar14 + 1] = (stbi__uint16)iVar17;
    iVar21 = *(int *)(local_c8 + lVar14 * 4 + 4);
    iVar18 = iVar18 + iVar21;
    if ((iVar21 != 0) && (1 << ((char)lVar14 + 1U & 0x1f) < iVar18)) break;
    z->maxcode[lVar14 + 1] = iVar18 << (bVar9 & 0x1f);
    iVar18 = iVar18 * 2;
    iVar17 = iVar17 + iVar21;
    bVar9 = bVar9 - 1;
    lVar14 = lVar14 + 1;
    if (lVar14 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      auVar8 = _DAT_0015f3b0;
      auVar7 = _DAT_0015f3a0;
      auVar6 = _DAT_0015f390;
      auVar5 = _DAT_0015f380;
      auVar4 = _DAT_0015f2b0;
      if (0 < num) {
        uVar13 = 0;
        do {
          bVar9 = sizelist[uVar13];
          if (bVar9 != 0) {
            iVar18 = aiStack_78[bVar9];
            lVar14 = (long)(int)(iVar18 - (uint)z->firstcode[bVar9]) + (ulong)z->firstsymbol[bVar9];
            z->size[lVar14] = bVar9;
            z->value[lVar14] = (ushort)uVar13;
            if ((bVar9 < 10) &&
               (uVar10 = (ushort)iVar18 << 8 | (ushort)iVar18 >> 8,
               uVar11 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4,
               uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4,
               uVar11 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555) * 2 >> (0x10 - bVar9 & 0x1f),
               uVar11 < 0x200)) {
              uVar10 = (ushort)uVar13 | (ushort)bVar9 << 9;
              lVar14 = 1L << (bVar9 & 0x3f);
              uVar12 = lVar14 + (ulong)uVar11;
              uVar16 = (ulong)(uVar12 < 0x200);
              uVar19 = 0x200;
              if (0x200 < uVar12) {
                uVar19 = uVar12;
              }
              uVar19 = (uVar19 - uVar16) - uVar12 >> (bVar9 & 0x3f);
              lVar15 = uVar16 + uVar19;
              auVar20._8_4_ = (int)lVar15;
              auVar20._0_8_ = lVar15;
              auVar20._12_4_ = (int)((ulong)lVar15 >> 0x20);
              auVar20 = auVar20 ^ auVar4;
              uVar12 = 0;
              do {
                lVar15 = (uVar12 << (bVar9 & 0x3f)) + (ulong)uVar11;
                auVar32._8_4_ = (int)uVar12;
                auVar32._0_8_ = uVar12;
                auVar32._12_4_ = (int)(uVar12 >> 0x20);
                auVar24 = (auVar32 | auVar8) ^ auVar4;
                iVar17 = auVar20._0_4_;
                iVar38 = -(uint)(iVar17 < auVar24._0_4_);
                iVar21 = auVar20._4_4_;
                auVar25._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
                iVar37 = auVar20._8_4_;
                iVar40 = -(uint)(iVar37 < auVar24._8_4_);
                iVar22 = auVar20._12_4_;
                auVar25._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
                auVar34._4_4_ = iVar38;
                auVar34._0_4_ = iVar38;
                auVar34._8_4_ = iVar40;
                auVar34._12_4_ = iVar40;
                auVar41 = pshuflw(in_XMM11,auVar34,0xe8);
                auVar27._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
                auVar27._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar43 = pshuflw(in_XMM12,auVar27,0xe8);
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar42 = pshuflw(auVar41,auVar25,0xe8);
                auVar24._8_4_ = 0xffffffff;
                auVar24._0_8_ = 0xffffffffffffffff;
                auVar24._12_4_ = 0xffffffff;
                auVar24 = (auVar42 | auVar43 & auVar41) ^ auVar24;
                auVar24 = packssdw(auVar24,auVar24);
                if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  z->fast[lVar15] = uVar10;
                }
                auVar25 = auVar27 & auVar34 | auVar25;
                auVar24 = packssdw(auVar25,auVar25);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar42,auVar24 ^ auVar42);
                if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
                  z->fast[lVar15 + lVar14] = uVar10;
                }
                auVar24 = (auVar32 | auVar7) ^ auVar4;
                iVar38 = -(uint)(iVar17 < auVar24._0_4_);
                auVar39._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
                iVar40 = -(uint)(iVar37 < auVar24._8_4_);
                auVar39._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
                auVar26._4_4_ = iVar38;
                auVar26._0_4_ = iVar38;
                auVar26._8_4_ = iVar40;
                auVar26._12_4_ = iVar40;
                auVar33._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
                auVar33._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
                auVar33._0_4_ = auVar33._4_4_;
                auVar33._8_4_ = auVar33._12_4_;
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                auVar24 = auVar33 & auVar26 | auVar39;
                auVar24 = packssdw(auVar24,auVar24);
                auVar1._8_4_ = 0xffffffff;
                auVar1._0_8_ = 0xffffffffffffffff;
                auVar1._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar1,auVar24 ^ auVar1);
                if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  z->fast[lVar14 * 2 + lVar15] = uVar10;
                }
                auVar27 = pshufhw(auVar26,auVar26,0x84);
                auVar34 = pshufhw(auVar33,auVar33,0x84);
                auVar25 = pshufhw(auVar27,auVar39,0x84);
                auVar28._8_4_ = 0xffffffff;
                auVar28._0_8_ = 0xffffffffffffffff;
                auVar28._12_4_ = 0xffffffff;
                auVar28 = (auVar25 | auVar34 & auVar27) ^ auVar28;
                auVar27 = packssdw(auVar28,auVar28);
                if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  z->fast[lVar15 + (3L << (bVar9 & 0x3f))] = uVar10;
                }
                auVar27 = (auVar32 | auVar6) ^ auVar4;
                iVar38 = -(uint)(iVar17 < auVar27._0_4_);
                auVar30._4_4_ = -(uint)(iVar21 < auVar27._4_4_);
                iVar40 = -(uint)(iVar37 < auVar27._8_4_);
                auVar30._12_4_ = -(uint)(iVar22 < auVar27._12_4_);
                auVar35._4_4_ = iVar38;
                auVar35._0_4_ = iVar38;
                auVar35._8_4_ = iVar40;
                auVar35._12_4_ = iVar40;
                auVar24 = pshuflw(auVar24,auVar35,0xe8);
                auVar29._4_4_ = -(uint)(auVar27._4_4_ == iVar21);
                auVar29._12_4_ = -(uint)(auVar27._12_4_ == iVar22);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                in_XMM12 = pshuflw(auVar43 & auVar41,auVar29,0xe8);
                in_XMM12 = in_XMM12 & auVar24;
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar24 = pshuflw(auVar24,auVar30,0xe8);
                auVar41._8_4_ = 0xffffffff;
                auVar41._0_8_ = 0xffffffffffffffff;
                auVar41._12_4_ = 0xffffffff;
                auVar41 = (auVar24 | in_XMM12) ^ auVar41;
                in_XMM11 = packssdw(auVar41,auVar41);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  z->fast[lVar15 + lVar14 * 4] = uVar10;
                }
                auVar30 = auVar29 & auVar35 | auVar30;
                auVar24 = packssdw(auVar30,auVar30);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar43,auVar24 ^ auVar43);
                if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  z->fast[lVar15 + (5L << (bVar9 & 0x3f))] = uVar10;
                }
                auVar24 = (auVar32 | auVar5) ^ auVar4;
                iVar17 = -(uint)(iVar17 < auVar24._0_4_);
                auVar36._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
                iVar37 = -(uint)(iVar37 < auVar24._8_4_);
                auVar36._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
                auVar31._4_4_ = iVar17;
                auVar31._0_4_ = iVar17;
                auVar31._8_4_ = iVar37;
                auVar31._12_4_ = iVar37;
                auVar23._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
                auVar23._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
                auVar23._0_4_ = auVar23._4_4_;
                auVar23._8_4_ = auVar23._12_4_;
                auVar36._0_4_ = auVar36._4_4_;
                auVar36._8_4_ = auVar36._12_4_;
                auVar24 = auVar23 & auVar31 | auVar36;
                auVar24 = packssdw(auVar24,auVar24);
                auVar2._8_4_ = 0xffffffff;
                auVar2._0_8_ = 0xffffffffffffffff;
                auVar2._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar2,auVar24 ^ auVar2);
                if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  z->fast[lVar15 + (6L << (bVar9 & 0x3f))] = uVar10;
                }
                auVar32 = pshufhw(auVar31,auVar31,0x84);
                auVar24 = pshufhw(auVar23,auVar23,0x84);
                auVar27 = pshufhw(auVar32,auVar36,0x84);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 & auVar32,(auVar27 | auVar24 & auVar32) ^ auVar3);
                if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  z->fast[lVar15 + (7L << (bVar9 & 0x3f))] = uVar10;
                }
                uVar12 = uVar12 + 8;
              } while ((uVar16 + uVar19 + 8 & 0xfffffffffffffff8) != uVar12);
            }
            aiStack_78[bVar9] = iVar18 + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)num);
      }
      return 1;
    }
  }
  stbi__g_failure_reason = "bad codelengths";
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}